

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

WW<135UL> * __thiscall GF2::WW<135UL>::Permute(WW<135UL> *this,size_t *pi)

{
  ulong uVar1;
  byte bVar2;
  size_t pos;
  ulong uVar3;
  WW<135UL> temp;
  
  temp._words[0] = 0;
  temp._words[1] = 0;
  temp._words[2] = 0;
  uVar3 = 0;
  do {
    uVar1 = pi[uVar3];
    if ((uVar1 == 0xffffffffffffffff) || ((this->_words[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0)) {
      bVar2 = (byte)uVar3 & 0x3f;
      temp._words[uVar3 >> 6] =
           temp._words[uVar3 >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    }
    else {
      temp._words[uVar3 >> 6] = temp._words[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x87);
  this->_words[2] = temp._words[2];
  this->_words[0] = temp._words[0];
  this->_words[1] = temp._words[1];
  return this;
}

Assistant:

WW& Permute(const size_t pi[_n])
	{	
		WW<_n> temp;
		for (size_t pos = 0; pos < _n; ++pos)
			temp.Set(pos, pi[pos] == SIZE_MAX ? 0 : Test(pi[pos]));
		return operator=(temp);
	}